

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SchemaValidator::faultInAttr(SchemaValidator *this,XMLAttr *toFill,XMLAttDef *attDef)

{
  uint uriId;
  AttTypes type;
  QName *this_00;
  XMLCh *attrName;
  XMLCh *attrPrefix;
  XMLCh *attrValue;
  QName *attName;
  SchemaAttDef *schemaAttDef;
  XMLAttDef *attDef_local;
  XMLAttr *toFill_local;
  SchemaValidator *this_local;
  
  this_00 = SchemaAttDef::getAttName((SchemaAttDef *)attDef);
  uriId = QName::getURI(this_00);
  attrName = QName::getLocalPart(this_00);
  attrPrefix = QName::getPrefix(this_00);
  attrValue = XMLAttDef::getValue(attDef);
  type = XMLAttDef::getType(attDef);
  XMLAttr::set(toFill,uriId,attrName,attrPrefix,attrValue,type,(DatatypeValidator *)0x0,false);
  return;
}

Assistant:

void SchemaValidator::faultInAttr (XMLAttr&    toFill, const XMLAttDef&  attDef)   const
{
    //
    //  At this level, we cannot set the URI id. So we just set it to zero
    //  and leave it at that. The scanner, who called us, will look at the
    //  prefix we stored (if any), resolve it, and store the URL id if any.
    //
    SchemaAttDef* schemaAttDef = (SchemaAttDef*) &attDef;
    QName* attName = schemaAttDef->getAttName();

    toFill.set
    (
          attName->getURI()
        , attName->getLocalPart()
        , attName->getPrefix()
        , schemaAttDef->getValue()
        , schemaAttDef->getType()
    );
}